

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

string * __thiscall
soul::heart::Parser::readQualifiedVariableIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  string local_50;
  string local_30;
  
  readVariableIdentifier_abi_cxx11_(&local_50,this);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x259477);
  if (bVar1) {
    readQualifiedGeneralIdentifier_abi_cxx11_(&local_30,this);
    TokenisedPathString::join(__return_storage_ptr__,&local_50,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_50.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_50.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_50._M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string readQualifiedVariableIdentifier()
    {
        auto part1 = readVariableIdentifier();

        if (matchIf (HEARTOperator::doubleColon))
            return TokenisedPathString::join (part1, readQualifiedGeneralIdentifier());

        return part1;
    }